

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O2

FilePath __thiscall
testing::internal::FilePath::GenerateUniqueFileName
          (FilePath *this,FilePath *directory,FilePath *base_name,char *extension)

{
  bool bVar1;
  size_t extraout_RDX;
  int number;
  FilePath FVar2;
  String local_40;
  
  FilePath(this);
  number = 0;
  do {
    MakeFileName((FilePath *)&local_40,directory,base_name,number,extension);
    String::operator=(&this->pathname_,&local_40);
    String::~String(&local_40);
    bVar1 = FileOrDirectoryExists(this);
    number = number + 1;
  } while (bVar1);
  FVar2.pathname_.length_ = extraout_RDX;
  FVar2.pathname_.c_str_ = (char *)this;
  return (FilePath)FVar2.pathname_;
}

Assistant:

FilePath FilePath::GenerateUniqueFileName(const FilePath& directory,
                                          const FilePath& base_name,
                                          const char* extension) {
  FilePath full_pathname;
  int number = 0;
  do {
    full_pathname.Set(MakeFileName(directory, base_name, number++, extension));
  } while (full_pathname.FileOrDirectoryExists());
  return full_pathname;
}